

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::UniversalPrinter<std::optional<solitaire::cards::Card>_>::Print
               (Optional<solitaire::cards::Card> *value,ostream *os)

{
  std::operator<<(os,'(');
  if ((value->super__Optional_base<solitaire::cards::Card,_true,_true>)._M_payload.
      super__Optional_payload_base<solitaire::cards::Card>._M_engaged == false) {
    std::operator<<(os,"nullopt");
  }
  else {
    solitaire::cards::operator<<(os,(Card *)value);
  }
  std::operator<<(os,')');
  return;
}

Assistant:

static void Print(const Optional<T>& value, ::std::ostream* os) {
    *os << '(';
    if (!value) {
      *os << "nullopt";
    } else {
      UniversalPrint(*value, os);
    }
    *os << ')';
  }